

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menus.cpp
# Opt level: O0

void __thiscall CMenus::UpdateMusicState(CMenus *this)

{
  bool bVar1;
  int iVar2;
  IClient *this_00;
  CConfig *pCVar3;
  undefined8 in_RDI;
  CSounds *unaff_retaddr;
  int in_stack_0000000c;
  bool ShouldPlay;
  undefined6 in_stack_fffffffffffffff0;
  undefined1 uVar4;
  byte bVar5;
  undefined8 uVar6;
  int SetId;
  
  uVar6 = in_RDI;
  this_00 = CComponent::Client((CComponent *)0x17bd8b);
  SetId = (int)((ulong)uVar6 >> 0x20);
  iVar2 = IClient::State(this_00);
  uVar4 = false;
  if (iVar2 == 0) {
    pCVar3 = CComponent::Config((CComponent *)0x17bda9);
    uVar4 = false;
    if (pCVar3->m_SndEnable != 0) {
      pCVar3 = CComponent::Config((CComponent *)0x17bdc4);
      uVar4 = pCVar3->m_SndMusic != 0;
    }
  }
  bVar5 = uVar4;
  if (((bool)uVar4 == false) ||
     (bVar1 = CSounds::IsPlaying((CSounds *)this,in_stack_0000000c), bVar1)) {
    if (((bVar5 & 1) == 0) && (bVar1 = CSounds::IsPlaying((CSounds *)this,in_stack_0000000c), bVar1)
       ) {
      CSounds::Stop(unaff_retaddr,SetId);
    }
  }
  else {
    CSounds::Enqueue((CSounds *)CONCAT17(bVar5,CONCAT16(uVar4,in_stack_fffffffffffffff0)),
                     (int)((ulong)in_RDI >> 0x20),(int)in_RDI);
  }
  return;
}

Assistant:

void CMenus::UpdateMusicState()
{
	bool ShouldPlay = Client()->State() == IClient::STATE_OFFLINE && Config()->m_SndEnable && Config()->m_SndMusic;
	if(ShouldPlay && !m_pClient->m_pSounds->IsPlaying(SOUND_MENU))
		m_pClient->m_pSounds->Enqueue(CSounds::CHN_MUSIC, SOUND_MENU);
	else if(!ShouldPlay && m_pClient->m_pSounds->IsPlaying(SOUND_MENU))
		m_pClient->m_pSounds->Stop(SOUND_MENU);
}